

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O1

void __thiscall SimpleParallelAnalyzer::DecodeBothEdges(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *pSVar1;
  byte bVar2;
  char cVar3;
  uint16_t value;
  int iVar4;
  uint64_t ending_sample;
  uint64_t ending_sample_inclusive;
  uint64_t uVar5;
  byte bVar6;
  uint64_t starting_sample;
  
  starting_sample = 0;
  value = 0;
  bVar6 = 0;
  do {
    bVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (((bVar2 | ~bVar6) & 1) == 0) {
      cVar3 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mClock);
      if (cVar3 == '\0') {
        AnalyzerChannelData::Advance((uint)this->mClock);
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
      }
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      cVar3 = '\x01';
    }
    ending_sample = AnalyzerChannelData::GetSampleNumber();
    if (bVar6 == 0) {
      uVar5 = 0;
    }
    else {
      AddFrame(this,value,starting_sample,ending_sample);
      bVar6 = 0;
      uVar5 = ending_sample;
    }
    if (cVar3 != '\0') {
      value = GetWordAtLocation(this,ending_sample);
      pSVar1 = (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl;
      iVar4 = AnalyzerChannelData::GetBitState();
      AnalyzerResults::AddMarker
                ((ulonglong)pSVar1,(MarkerType)ending_sample,(Channel *)(ulong)((iVar4 == 0) + 4));
      bVar6 = 1;
      starting_sample = ending_sample;
    }
    if (uVar5 != 0) {
      Analyzer::ReportProgress((ulonglong)this);
    }
  } while( true );
}

Assistant:

void SimpleParallelAnalyzer::DecodeBothEdges()
{
    // helper to allow us to successfully report the last edge, even if there are no more edges in the capture.
    // Normally, in order to report a specific edge, the following edge must be found first.
    // If that following edge does not exist, and never will exist, instead we advance a intermediate amount, and return false.
    // If there is another edge, we advance to it and return true.
    // force_advance optionally ensures we advance to the next edge. If there are no more edges in the data, this will never return.
    auto advance_to_next_edge_or_fail = [&]( bool force_advance ) -> bool {
        if( mClock->DoMoreTransitionsExistInCurrentData() || force_advance )
        {
            mClock->AdvanceToNextEdge();
            return true;
        }
        int64_t estimated_frame_size = mLastFrameWidth > 0 ? std::max<int64_t>( static_cast<int64_t>( mLastFrameWidth * 0.1 ), 2 ) : 10;
        if( mClock->WouldAdvancingCauseTransition( estimated_frame_size ) )
        {
            // this condition will only be true if we're very lucky, and we're processing data while recording in real time.
            mClock->AdvanceToNextEdge();
            return true;
        }
        mClock->Advance( estimated_frame_size );
        return false;
    };

    // Frames start at the active edge, and extend to the following edge -1. (or they extend to an estimated width, if no more data is
    // found.)
    // we must advance past the active edge before committing the result from that edge.

    // has_pending_frame indicates that we have a word to store after the previous cycle.
    bool has_pending_frame = false;
    uint16_t previous_value = 0;
    uint64_t previous_sample = 0;

    for( ;; )
    {
        // advance to the next active edge.
        auto found_next_edge = advance_to_next_edge_or_fail( !has_pending_frame );
        auto location = mClock->GetSampleNumber();
        uint64_t progress_update = 0;
        if( has_pending_frame )
        {
            // store the previous frame.
            uint64_t ending_sample_inclusive = location;
            progress_update = AddFrame( previous_value, previous_sample, ending_sample_inclusive );
            has_pending_frame = false;
        }
        if( found_next_edge )
        {
            has_pending_frame = true;
            previous_sample = location;
            previous_value = GetWordAtLocation( location );

            mResults->AddMarker( location, mClock->GetBitState() == BIT_LOW ? AnalyzerResults::DownArrow : AnalyzerResults::UpArrow,
                                 mSettings->mClockChannel );
        }

        if( progress_update > 0 )
        {
            ReportProgress( progress_update );
        }
    }
}